

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O2

int __thiscall Random_keys::avancaGeracoes(Random_keys *this,Graph *g)

{
  vector<RK_Individual_*,_std::allocator<RK_Individual_*>_> *this_00;
  vector<RK_Individual_*,_std::allocator<RK_Individual_*>_> *this_01;
  double dVar1;
  value_type pRVar2;
  RK_Individual *pai1;
  RK_Individual *pai2;
  int iVar3;
  int iVar4;
  reference ppRVar5;
  uint uVar6;
  int iVar8;
  ulong uVar9;
  Random_keys *pRVar10;
  uint uVar11;
  size_type sVar12;
  uint uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int local_84;
  double local_80;
  ulong uVar7;
  
  this_00 = &this->popAtual;
  ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                      (this_00,(long)this->tamPop - 1);
  pRVar2 = *ppRVar5;
  ordenaPopulacaoAtual(this,g);
  this_01 = &this->popAnterior;
  iVar8 = 0;
  local_84 = 0;
  local_80 = pRVar2->active_loss * 100000.0;
  while( true ) {
    iVar3 = this->numGeracoes;
    ordenaPopulacaoAtual(this,g);
    if (iVar3 <= iVar8) break;
    ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                        (this_00,(long)this->tamPop - 1);
    dVar14 = (*ppRVar5)->active_loss * 100000.0;
    dVar15 = dVar14;
    if (local_80 <= dVar14) {
      dVar15 = local_80;
    }
    std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::operator=(this_01,this_00);
    iVar3 = this->tamPop;
    dVar16 = (double)iVar3;
    uVar6 = (uint)(dVar16 * 0.05);
    uVar7 = (ulong)uVar6;
    for (sVar12 = (size_type)(int)uVar6; (long)sVar12 < (long)(iVar3 - (int)(dVar16 * 0.1));
        sVar12 = sVar12 + 1) {
      iVar3 = rand();
      iVar3 = iVar3 % this->tamPop;
      iVar4 = rand();
      uVar13 = iVar4 % this->tamPop;
      iVar4 = rand();
      uVar11 = iVar4 % this->tamPop;
      iVar4 = rand();
      uVar9 = (long)iVar4 % (long)this->tamPop;
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)(int)uVar13);
      dVar1 = (*ppRVar5)->active_loss;
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)(int)uVar11);
      if (dVar1 < (*ppRVar5)->active_loss) {
        uVar11 = uVar13;
      }
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)(int)uVar11);
      dVar1 = (*ppRVar5)->active_loss;
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)(int)uVar9);
      uVar9 = uVar9 & 0xffffffff;
      if (dVar1 < (*ppRVar5)->active_loss) {
        uVar9 = (ulong)uVar11;
      }
      while ((int)uVar9 == iVar3) {
        iVar4 = rand();
        uVar9 = (long)iVar4 % (long)this->tamPop & 0xffffffff;
      }
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)iVar3);
      pai1 = *ppRVar5;
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at
                          (this_01,(long)(int)uVar9);
      pai2 = *ppRVar5;
      pRVar10 = (Random_keys *)this_00;
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at(this_00,sVar12);
      cruzamento1(pRVar10,pai1,pai2,*ppRVar5);
      pRVar10 = (Random_keys *)this_00;
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at(this_00,sVar12);
      mutacao(pRVar10,*ppRVar5);
      iVar3 = this->tamPop;
    }
    if ((int)uVar6 < 1) {
      uVar7 = 0;
    }
    for (sVar12 = 0; uVar7 != sVar12; sVar12 = sVar12 + 1) {
      ppRVar5 = std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::at(this_00,sVar12);
      RK_Individual::generate_random_weights(*ppRVar5);
    }
    if (dVar14 < local_80) {
      local_84 = iVar8;
    }
    iVar8 = iVar8 + 1;
    local_80 = dVar15;
  }
  return local_84;
}

Assistant:

int Random_keys::avancaGeracoes(Graph *g){

    int melhorGeracao = 0;
    RK_Individual *best = popAtual.at(this->tamPop - 1);
    this->ordenaPopulacaoAtual(g);
    double perda = 100*1000*best->getActiveLoss();
    for(int k=0; k<this->numGeracoes; k++){

        /** calcula a funcao criterio para cada individuo
        e ordena a populacao da maior perda(pior individuo)
        pra menor perda(melhor individuo), perdaAtiva**/
        this->ordenaPopulacaoAtual(g);

        RK_Individual *best = popAtual.at(this->tamPop - 1);
        if (100*1000*best->getActiveLoss() < perda){
            perda = 100*1000*best->getActiveLoss();
//            printf("\ngeracao (%d)  melhor individuo: %lf kw", k, 100*1000*best->getPerdaAtiva());//resultado ja em kw
            melhorGeracao = k;
        }

        popAnterior = popAtual;

        int num_piores = 0.05*this->tamPop;
        int num_melhores = 0.1*this->tamPop;

        for(int i=num_piores; i<this->tamPop-num_melhores; i++){

            /** cruzamento entre pai1 e pai2 entre os
            individuos aleatorios da populacao anterior
            modificar por uma escolha em roleta no futuro**/
            int pai1 = rand() % this->tamPop;
//            int pai2 = rand() % this->tamPop; //aleatorio

            /**torneio com 3**/
            int cand1, cand2, cand3;
            cand1 = rand() % this->tamPop;
            cand2 = rand() % this->tamPop;
            cand3 = rand() % this->tamPop;

            if(popAnterior.at(cand1)->getActiveLoss() < popAnterior.at(cand2)->getActiveLoss()){
                cand2=cand1;
            }
            if(popAnterior.at(cand2)->getActiveLoss() < popAnterior.at(cand3)->getActiveLoss()){
                cand3=cand2;
            }

            int pai2 = cand3;

            while(pai2==pai1)
                pai2 = rand() % this->tamPop;

//            popAnterior.at(pai1)->cruzamentoMedia(popAnterior.at(pai2), popAtual.at(i));
            this->cruzamento1(popAnterior.at(pai1), popAnterior.at(pai2), popAtual.at(i));
//            popAtual.at(i)->mutacao();
            this->mutacao(popAtual.at(i));
        }

        /**aleatorio ao inves de manter piores**/
        for(int i=0; i<num_piores; i++)
            popAtual.at(i)->generate_random_weights();
    }

    this->ordenaPopulacaoAtual(g);

    return melhorGeracao;
}